

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraLcr.c
# Opt level: O0

void Fra_ClassNodesMark(Fra_Lcr_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined8 *puVar4;
  void *pvVar5;
  Aig_Obj_t *pAVar6;
  int local_28;
  int Offset;
  int c;
  int i;
  Aig_Obj_t **ppClass;
  Aig_Obj_t *pObj;
  Fra_Lcr_t *p_local;
  
  iVar1 = Aig_ManCoNum(p->pCla->pAig);
  iVar2 = Aig_ManCiNum(p->pCla->pAig);
  for (Offset = 0; iVar3 = Vec_PtrSize(p->pCla->vClasses1), Offset < iVar3; Offset = Offset + 1) {
    puVar4 = (undefined8 *)Vec_PtrEntry(p->pCla->vClasses1,Offset);
    pAVar6 = Aig_ManCo(p->pCla->pAig,(iVar1 - iVar2) + (int)*puVar4);
    *(ulong *)&pAVar6->field_0x18 = *(ulong *)&pAVar6->field_0x18 & 0xffffffffffffffef | 0x10;
  }
  for (Offset = 0; iVar3 = Vec_PtrSize(p->pCla->vClasses), Offset < iVar3; Offset = Offset + 1) {
    pvVar5 = Vec_PtrEntry(p->pCla->vClasses,Offset);
    local_28 = 0;
    while (*(long *)((long)pvVar5 + (long)local_28 * 8) != 0) {
      pAVar6 = Aig_ManCo(p->pCla->pAig,
                         (iVar1 - iVar2) + (int)**(undefined8 **)((long)pvVar5 + (long)local_28 * 8)
                        );
      *(ulong *)&pAVar6->field_0x18 = *(ulong *)&pAVar6->field_0x18 & 0xffffffffffffffef | 0x10;
      local_28 = local_28 + 1;
    }
  }
  return;
}

Assistant:

void Fra_ClassNodesMark( Fra_Lcr_t * p )
{
    Aig_Obj_t * pObj, ** ppClass;
    int i, c, Offset;
    // compute the LO/LI offset
    Offset = Aig_ManCoNum(p->pCla->pAig) - Aig_ManCiNum(p->pCla->pAig);
    // mark the nodes remaining in the classes
    Vec_PtrForEachEntry( Aig_Obj_t *, p->pCla->vClasses1, pObj, i )
    {
        pObj = Aig_ManCo( p->pCla->pAig, Offset+(long)pObj->pNext );
        pObj->fMarkA = 1;
    }
    Vec_PtrForEachEntry( Aig_Obj_t **, p->pCla->vClasses, ppClass, i )
    {
        for ( c = 0; ppClass[c]; c++ )
        {
            pObj = Aig_ManCo( p->pCla->pAig, Offset+(long)ppClass[c]->pNext );
            pObj->fMarkA = 1;
        }
    }
}